

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-init.c
# Opt level: O1

void borg_free(void)

{
  event_remove_handler(EVENT_LEAVE_GAME,borg_leave_game,(void *)0x0);
  borg_free_update();
  borg_free_item();
  borg_free_store();
  borg_free_flow_kill();
  borg_free_flow_take();
  borg_free_item_wear();
  borg_free_flow();
  borg_free_cave();
  borg_free_io();
  borg_free_messages();
  borg_free_txt_file();
  return;
}

Assistant:

void borg_free(void)
{
    /* Undo the allocations in reverse order from what borg_init() does. */
    event_remove_handler(EVENT_LEAVE_GAME, borg_leave_game, NULL);
    borg_free_update();
    borg_free_item();
    borg_free_store();

    borg_free_flow_kill();
    borg_free_flow_take();
    borg_free_item_wear();

    borg_free_flow();
    borg_free_cave();
    borg_free_io();

    borg_free_messages();
    borg_free_txt_file();
}